

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_digest.c
# Opt level: O2

CURLcode Curl_output_digest(Curl_easy *data,_Bool proxy,uchar *request,uchar *uripath)

{
  digestdata *digest;
  char **ppcVar1;
  byte bVar2;
  CURLcode CVar3;
  char *pcVar4;
  uchar *puVar5;
  uint uVar6;
  int iVar7;
  undefined7 in_register_00000031;
  char **ppcVar8;
  char *userp;
  char *pcVar9;
  long lVar10;
  char *response;
  uchar *local_48;
  uchar *local_40;
  size_t len;
  
  iVar7 = (int)CONCAT71(in_register_00000031,proxy);
  uVar6 = iVar7 << 5;
  digest = &(data->state).digest;
  ppcVar1 = &(data->state).aptr.user;
  ppcVar8 = &(data->state).aptr.passwd;
  lVar10 = 0x1370;
  if (iVar7 != 0) {
    lVar10 = 0x13b8;
    ppcVar8 = &(data->state).aptr.proxypasswd;
    digest = &(data->state).proxydigest;
    ppcVar1 = &(data->state).aptr.proxyuser;
  }
  pcVar9 = *ppcVar8;
  userp = *ppcVar1;
  local_48 = request;
  local_40 = uripath;
  (*Curl_cfree)(*(void **)((long)&data->magic + lVar10));
  puVar5 = local_40;
  *(undefined8 *)((long)&data->magic + lVar10) = 0;
  if (userp == (char *)0x0) {
    userp = "";
  }
  if (pcVar9 == (char *)0x0) {
    pcVar9 = "";
  }
  bVar2 = (&(data->state).authhost.field_0x18)[uVar6];
  if (digest->nonce == (char *)0x0) {
    bVar2 = bVar2 & 0xfe;
  }
  else {
    if (((bVar2 & 4) == 0) || (pcVar4 = strchr((char *)local_40,0x3f), pcVar4 == (char *)0x0)) {
      puVar5 = (uchar *)(*Curl_cstrdup)((char *)puVar5);
    }
    else {
      puVar5 = (uchar *)curl_maprintf("%.*s",(ulong)(uint)((int)pcVar4 - (int)puVar5),puVar5);
    }
    if (puVar5 == (uchar *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    CVar3 = Curl_auth_create_digest_http_message
                      (data,userp,pcVar9,local_48,puVar5,digest,&response,&len);
    (*Curl_cfree)(puVar5);
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    pcVar9 = "";
    if (proxy) {
      pcVar9 = "Proxy-";
    }
    pcVar9 = curl_maprintf("%sAuthorization: Digest %s\r\n",pcVar9,response);
    *(char **)((long)&data->magic + lVar10) = pcVar9;
    (*Curl_cfree)(response);
    if (*(long *)((long)&data->magic + lVar10) == 0) {
      return CURLE_OUT_OF_MEMORY;
    }
    bVar2 = (&(data->state).authhost.field_0x18)[uVar6] | 1;
  }
  (&(data->state).authhost.field_0x18)[uVar6] = bVar2;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_output_digest(struct Curl_easy *data,
                            bool proxy,
                            const unsigned char *request,
                            const unsigned char *uripath)
{
  CURLcode result;
  unsigned char *path = NULL;
  char *tmp = NULL;
  char *response;
  size_t len;
  bool have_chlg;

  /* Point to the address of the pointer that holds the string to send to the
     server, which is for a plain host or for an HTTP proxy */
  char **allocuserpwd;

  /* Point to the name and password for this */
  const char *userp;
  const char *passwdp;

  /* Point to the correct struct with this */
  struct digestdata *digest;
  struct auth *authp;

  if(proxy) {
#ifdef CURL_DISABLE_PROXY
    return CURLE_NOT_BUILT_IN;
#else
    digest = &data->state.proxydigest;
    allocuserpwd = &data->state.aptr.proxyuserpwd;
    userp = data->state.aptr.proxyuser;
    passwdp = data->state.aptr.proxypasswd;
    authp = &data->state.authproxy;
#endif
  }
  else {
    digest = &data->state.digest;
    allocuserpwd = &data->state.aptr.userpwd;
    userp = data->state.aptr.user;
    passwdp = data->state.aptr.passwd;
    authp = &data->state.authhost;
  }

  Curl_safefree(*allocuserpwd);

  /* not set means empty */
  if(!userp)
    userp = "";

  if(!passwdp)
    passwdp = "";

#if defined(USE_WINDOWS_SSPI)
  have_chlg = digest->input_token ? TRUE : FALSE;
#else
  have_chlg = digest->nonce ? TRUE : FALSE;
#endif

  if(!have_chlg) {
    authp->done = FALSE;
    return CURLE_OK;
  }

  /* So IE browsers < v7 cut off the URI part at the query part when they
     evaluate the MD5 and some (IIS?) servers work with them so we may need to
     do the Digest IE-style. Note that the different ways cause different MD5
     sums to get sent.

     Apache servers can be set to do the Digest IE-style automatically using
     the BrowserMatch feature:
     https://httpd.apache.org/docs/2.2/mod/mod_auth_digest.html#msie

     Further details on Digest implementation differences:
     http://www.fngtps.com/2006/09/http-authentication
  */

  if(authp->iestyle) {
    tmp = strchr((char *)uripath, '?');
    if(tmp) {
      size_t urilen = tmp - (char *)uripath;
      /* typecast is fine here since the value is always less than 32 bits */
      path = (unsigned char *) aprintf("%.*s", (int)urilen, uripath);
    }
  }
  if(!tmp)
    path = (unsigned char *) strdup((char *) uripath);

  if(!path)
    return CURLE_OUT_OF_MEMORY;

  result = Curl_auth_create_digest_http_message(data, userp, passwdp, request,
                                                path, digest, &response, &len);
  free(path);
  if(result)
    return result;

  *allocuserpwd = aprintf("%sAuthorization: Digest %s\r\n",
                          proxy ? "Proxy-" : "",
                          response);
  free(response);
  if(!*allocuserpwd)
    return CURLE_OUT_OF_MEMORY;

  authp->done = TRUE;

  return CURLE_OK;
}